

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall trun::Config::Dump(Config *this)

{
  pointer pbVar1;
  string *psVar2;
  ResultSummary *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *pcVar3;
  char *pcVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  
  puts("Current Configuration");
  printf("TestRunner v%s - %s\n",(this->version)._M_dataplus._M_p,
         (this->description)._M_dataplus._M_p);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (this->verbose == 0) {
    pcVar3 = "no";
  }
  printf("  Verbose....: %s (%d)\n",pcVar3);
  pcVar3 = "yes";
  if (this->listTests == false) {
    pcVar3 = "no";
  }
  printf("  List Tests.: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->executeTests == false) {
    pcVar3 = "no";
  }
  printf("  Run Tests..: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->printPassSummary == false) {
    pcVar3 = "no";
  }
  printf("  Pass in summary: %s\n",pcVar3);
  printf("  TestMain...: %s\n",(this->mainFuncName)._M_dataplus._M_p);
  pcVar3 = "yes";
  if (this->testModuleGlobals == false) {
    pcVar3 = "no";
  }
  printf("  Test Module Globals: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->testGlobalMain == false) {
    pcVar3 = "no";
  }
  printf("  Test Main Global: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->testLogFilter == false) {
    pcVar3 = "no";
  }
  printf("  TestCase Log Filter: %s\n",pcVar3);
  printf("  Response Message Size Limit: %u\n",(ulong)this->responseMsgByteLimit);
  pcVar3 = "yes";
  if (this->skipOnModuleFail == false) {
    pcVar3 = "no";
  }
  printf("  Skip rest on library failure: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->stopOnAllFail == false) {
    pcVar3 = "no";
  }
  printf("  Stop on full failure: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->suppressProgressMsg == false) {
    pcVar3 = "no";
  }
  printf("  Silent mode: %s\n",pcVar3);
  pcVar3 = "yes";
  if (this->discardTestReturnCode == false) {
    pcVar3 = "no";
  }
  printf("  Discard test return code: %s\n",pcVar3);
  printf("  Reporting module: %s\n",(this->reportingModule)._M_dataplus._M_p);
  printf("  Reporting indent size: %d\n",(ulong)(uint)this->reportIndent);
  psVar2 = ModuleExecutionTypeToStr_abi_cxx11_(this->moduleExecuteType);
  printf("  Module execution policy: %s\n",(psVar2->_M_dataplus)._M_p);
  psVar2 = TestExecutionTypeToStr_abi_cxx11_(this->testExecutionType);
  printf("  Testcase execution policy: %s\n",(psVar2->_M_dataplus)._M_p);
  if (this->continueOnAssert == false) {
    pcVar4 = "no";
  }
  printf("  Continue on assert: %s\n",pcVar4);
  puts("  Modules:");
  pbVar1 = (this->modules).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->modules).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::string((string *)&x,pbVar5);
    printf("    %s\n",x._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&x);
  }
  puts("  Test cases:");
  pbVar1 = (this->testcases).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->testcases).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::string((string *)&x,pbVar5);
    printf("    %s\n",x._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&x);
  }
  puts("  Inputs:");
  pbVar1 = (this->inputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::string((string *)&x,pbVar5);
    printf("    %s\n",x._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&x);
  }
  this_00 = ResultSummary::Instance();
  ResultSummary::ListReportingModules(this_00);
  putchar(10);
  return;
}

Assistant:

void Config::Dump() {
    printf("Current Configuration\n");
    printf("TestRunner v%s - %s\n", version.c_str(), description.c_str());
    printf("  Verbose....: %s (%d)\n",verbose?"yes":"no", verbose);
    printf("  List Tests.: %s\n", listTests?"yes":"no");
    printf("  Run Tests..: %s\n", executeTests?"yes":"no");
    printf("  Pass in summary: %s\n", printPassSummary?"yes":"no");
    printf("  TestMain...: %s\n", mainFuncName.c_str());
    printf("  Test Module Globals: %s\n", testModuleGlobals ? "yes" : "no");
    printf("  Test Main Global: %s\n", testGlobalMain?"yes":"no");
    printf("  TestCase Log Filter: %s\n", testLogFilter?"yes":"no");
    printf("  Response Message Size Limit: %" PRIu32 "\n", responseMsgByteLimit);
    printf("  Skip rest on library failure: %s\n", skipOnModuleFail?"yes":"no");
    printf("  Stop on full failure: %s\n", stopOnAllFail?"yes":"no");
    printf("  Silent mode: %s\n", suppressProgressMsg?"yes":"no");
    printf("  Discard test return code: %s\n", discardTestReturnCode?"yes":"no");
    printf("  Reporting module: %s\n", reportingModule.c_str());
    printf("  Reporting indent size: %d\n", reportIndent);
    printf("  Module execution policy: %s\n", ModuleExecutionTypeToStr(moduleExecuteType).c_str());
    printf("  Testcase execution policy: %s\n", TestExecutionTypeToStr(testExecutionType).c_str());
    printf("  Continue on assert: %s\n", continueOnAssert?"yes":"no");
    printf("  Modules:\n");
    for(auto x:modules) {
        printf("    %s\n", x.c_str());
    }
    printf("  Test cases:\n");
    for(auto x:testcases) {
        printf("    %s\n", x.c_str());
    }
    printf("  Inputs:\n");
    for(auto x:inputs) {
        printf("    %s\n", x.c_str());

    }
    ResultSummary::Instance().ListReportingModules();
    printf("\n");

}